

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vorbisfile.c
# Opt level: O1

int ov_crosslap(OggVorbis_File *vf1,OggVorbis_File *vf2)

{
  int ch2;
  vorbis_dsp_state *vd;
  vorbis_info *vi;
  int n2;
  int lapsize;
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  float **ppfVar5;
  float **lappcm;
  vorbis_info *vi_00;
  float *apfStack_70 [2];
  float **local_60;
  float **pcm;
  float *local_50;
  vorbis_dsp_state *local_48;
  vorbis_info *local_40;
  int local_38;
  int local_34;
  
  if (vf1 == vf2) {
    iVar1 = 0;
  }
  else {
    iVar1 = -0x83;
    if ((1 < vf1->ready_state) && (1 < vf2->ready_state)) {
      apfStack_70[0] = (float *)0x1ab034;
      iVar1 = _ov_initset(vf1);
      if (iVar1 == 0) {
        apfStack_70[0] = (float *)0x1ab040;
        iVar1 = _ov_initprime(vf2);
        if (iVar1 == 0) {
          if (vf1->seekable == 0) {
            vi_00 = vf1->vi;
          }
          else {
            vi_00 = vf1->vi;
            if (2 < vf1->ready_state) {
              vi_00 = vi_00 + vf1->current_link;
            }
          }
          if (vf2->seekable == 0) {
            local_40 = vf2->vi;
          }
          else {
            local_40 = vf2->vi;
            if (2 < vf2->ready_state) {
              local_40 = local_40 + vf2->current_link;
            }
          }
          iVar2 = -0x82;
          local_34 = -0x82;
          if (vf1->vi != (vorbis_info *)0x0) {
            apfStack_70[0] = (float *)0x1ab0cf;
            local_34 = vorbis_synthesis_halfrate_p(vf1->vi);
            local_34 = local_34 + 1;
          }
          if (vf2->vi != (vorbis_info *)0x0) {
            apfStack_70[0] = (float *)0x1ab0e2;
            iVar2 = vorbis_synthesis_halfrate_p(vf2->vi);
            iVar2 = iVar2 + 1;
          }
          lVar3 = -((long)vi_00->channels * 8 + 0xfU & 0xfffffffffffffff0);
          lappcm = (float **)((long)apfStack_70 + lVar3 + 8);
          iVar1 = 0;
          local_38 = iVar2;
          *(undefined8 *)((long)apfStack_70 + lVar3) = 0x1ab112;
          iVar2 = vorbis_info_blocksize(vi_00,0);
          vi = local_40;
          local_34 = iVar2 >> ((byte)local_34 & 0x1f);
          *(undefined8 *)((long)apfStack_70 + lVar3) = 0x1ab125;
          iVar2 = vorbis_info_blocksize(vi,0);
          local_38 = iVar2 >> ((byte)local_38 & 0x1f);
          local_48 = &vf1->vd;
          *(undefined8 *)((long)apfStack_70 + lVar3) = 0x1ab141;
          pcm = (float **)vorbis_window(&vf1->vd,0);
          *(undefined8 *)((long)apfStack_70 + lVar3) = 0x1ab157;
          local_50 = vorbis_window(&vf2->vd,0);
          iVar2 = vi_00->channels;
          ppfVar5 = lappcm;
          if (0 < (long)iVar2) {
            lVar3 = (long)local_34;
            lVar4 = 0;
            do {
              ppfVar5 = (float **)((long)ppfVar5 - (lVar3 * 4 + 0xfU & 0xfffffffffffffff0));
              lappcm[lVar4] = (float *)ppfVar5;
              lVar4 = lVar4 + 1;
            } while (iVar2 != lVar4);
          }
          lapsize = local_34;
          vd = local_48;
          ppfVar5[-1] = (float *)0x1ab1a4;
          _ov_getlap(vf1,vi_00,vd,lappcm,lapsize);
          ppfVar5[-1] = (float *)0x1ab1b3;
          vorbis_synthesis_lapout(&vf2->vd,&local_60);
          n2 = local_38;
          iVar2 = vi_00->channels;
          ch2 = local_40->channels;
          ppfVar5[-1] = local_50;
          ppfVar5[-2] = (float *)pcm;
          ppfVar5[-3] = (float *)0x1ab1d6;
          _ov_splice(local_60,lappcm,lapsize,n2,iVar2,ch2,ppfVar5[-2],ppfVar5[-1]);
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int ov_crosslap(OggVorbis_File *vf1, OggVorbis_File *vf2){
  vorbis_info *vi1,*vi2;
  float **lappcm;
  float **pcm;
  const float *w1,*w2;
  int n1,n2,i,ret,hs1,hs2;

  if(vf1==vf2)return(0); /* degenerate case */
  if(vf1->ready_state<OPENED)return(OV_EINVAL);
  if(vf2->ready_state<OPENED)return(OV_EINVAL);

  /* the relevant overlap buffers must be pre-checked and pre-primed
     before looking at settings in the event that priming would cross
     a bitstream boundary.  So, do it now */

  ret=_ov_initset(vf1);
  if(ret)return(ret);
  ret=_ov_initprime(vf2);
  if(ret)return(ret);

  vi1=ov_info(vf1,-1);
  vi2=ov_info(vf2,-1);
  hs1=ov_halfrate_p(vf1);
  hs2=ov_halfrate_p(vf2);

  lappcm=alloca(sizeof(*lappcm)*vi1->channels);
  n1=vorbis_info_blocksize(vi1,0)>>(1+hs1);
  n2=vorbis_info_blocksize(vi2,0)>>(1+hs2);
  w1=vorbis_window(&vf1->vd,0);
  w2=vorbis_window(&vf2->vd,0);

  for(i=0;i<vi1->channels;i++)
    lappcm[i]=alloca(sizeof(**lappcm)*n1);

  _ov_getlap(vf1,vi1,&vf1->vd,lappcm,n1);

  /* have a lapping buffer from vf1; now to splice it into the lapping
     buffer of vf2 */
  /* consolidate and expose the buffer. */
  vorbis_synthesis_lapout(&vf2->vd,&pcm);

#if 0
  _analysis_output_always("pcmL",0,pcm[0],n1*2,0,0,0);
  _analysis_output_always("pcmR",0,pcm[1],n1*2,0,0,0);
#endif

  /* splice */
  _ov_splice(pcm,lappcm,n1,n2,vi1->channels,vi2->channels,w1,w2);

  /* done */
  return(0);
}